

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimPatResim(Gia_Man_t *pGia,Vec_Int_t *vObjs,int nWords,Vec_Wrd_t *vSims)

{
  int iVar1;
  bool bVar2;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Vec_Wrd_t *vSims_local;
  int nWords_local;
  Vec_Int_t *vObjs_local;
  Gia_Man_t *pGia_local;
  
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjs);
    bVar2 = false;
    if (local_34 < iVar1) {
      iVar1 = Vec_IntEntry(vObjs,local_34);
      pGStack_30 = Gia_ManObj(pGia,iVar1);
      bVar2 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if (local_34 == 0) {
      iVar1 = Gia_ObjId(pGia,pGStack_30);
      Gia_ManSimPatSimNot(pGia,iVar1,pGStack_30,nWords,vSims);
    }
    else {
      iVar1 = Gia_ObjIsAnd(pGStack_30);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_30);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                        ,0x91,"void Gia_ManSimPatResim(Gia_Man_t *, Vec_Int_t *, int, Vec_Wrd_t *)")
          ;
        }
      }
      else {
        iVar1 = Gia_ObjId(pGia,pGStack_30);
        Gia_ManSimPatSimAnd(pGia,iVar1,pGStack_30,nWords,vSims);
      }
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Gia_ManSimPatResim( Gia_Man_t * pGia, Vec_Int_t * vObjs, int nWords, Vec_Wrd_t * vSims )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachObjVec( vObjs, pGia, pObj, i )
        if ( i == 0 )
            Gia_ManSimPatSimNot( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimPatSimAnd( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( !Gia_ObjIsCo(pObj) ) assert(0);
}